

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O1

void ZXing::QRCode::BuildMatrix
               (BitArray *dataBits,ErrorCorrectionLevel ecLevel,Version *version,int maskPattern,
               TritMatrix *matrix)

{
  uchar uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  pointer puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  pointer pTVar9;
  invalid_argument *piVar10;
  logic_error *plVar11;
  int iVar12;
  undefined4 in_register_0000000c;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  pointer pTVar16;
  pointer pTVar17;
  ulong uVar18;
  uint *puVar19;
  ulong uVar20;
  value_t vVar21;
  int iVar22;
  undefined8 *puVar23;
  int iVar24;
  long lVar25;
  uint *puVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar39;
  undefined1 auVar38 [16];
  BitArray maskBits;
  int local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  undefined8 local_c0;
  BitArray *local_b8;
  undefined8 local_b0;
  int local_a4;
  long local_a0;
  long local_98;
  string local_90;
  pointer local_70;
  ulong local_68;
  long local_60;
  long local_58;
  string local_50;
  long lVar33;
  
  local_b0 = CONCAT44(in_register_0000000c,maskPattern);
  pTVar9 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar17 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_b8 = dataBits;
  if (pTVar9 != pTVar17) {
    memset(pTVar9,2,(long)pTVar17 - (long)pTVar9);
  }
  EmbedPositionDetectionPattern(0,0,matrix);
  EmbedPositionDetectionPattern(matrix->_width + -7,0,matrix);
  EmbedPositionDetectionPattern(0,matrix->_width + -7,matrix);
  uVar15 = matrix->_width;
  uVar18 = (ulong)uVar15;
  pTVar9 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar9[((long)matrix->_height + -8) * (long)(int)uVar15 + 8].value = true_v;
  auVar7 = _DAT_001941f0;
  auVar6 = _DAT_001941e0;
  if (1 < version->_versionNumber) {
    puVar4 = (uint *)(version->_alignmentPatternCenters).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
    puVar3 = (uint *)(version->_alignmentPatternCenters).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
    for (puVar19 = puVar3; puVar19 != puVar4; puVar19 = puVar19 + 1) {
      uVar27 = *puVar19;
      iVar8 = matrix->_height;
      iVar22 = matrix->_width;
      pTVar17 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar26 = puVar3;
      do {
        uVar2 = *puVar26;
        if (uVar2 != 6 || (uVar27 ^ 6) != 0) {
          if ((uVar2 != 6 || iVar8 - 7U != uVar27) && (uVar2 != iVar22 - 7U || (uVar27 ^ 6) != 0)) {
            pTVar16 = pTVar17 + (long)(int)uVar2 + (long)(int)(uVar27 - 2) * (long)iVar22 + -1;
            lVar25 = 0;
            do {
              iVar12 = (int)lVar25 + -2;
              iVar34 = -iVar12;
              if (0 < iVar12) {
                iVar34 = iVar12;
              }
              auVar30._4_4_ = iVar34;
              auVar30._0_4_ = iVar34;
              auVar30._8_8_ = 0;
              auVar31 = auVar30 ^ auVar7;
              lVar13 = 0;
              auVar32 = auVar6;
              do {
                iVar37 = (int)lVar13 + -2;
                iVar39 = (int)lVar13 + -1;
                iVar34 = iVar37 >> 0x1f;
                iVar12 = iVar39 >> 0x1f;
                uVar20 = CONCAT44(iVar39,iVar37) ^ CONCAT44(iVar12,iVar34);
                auVar38._0_4_ = (int)uVar20 - iVar34;
                auVar38._4_4_ = (int)(uVar20 >> 0x20) - iVar12;
                auVar38._8_8_ = 0;
                auVar35 = auVar38 ^ auVar7;
                auVar36._0_4_ = -(uint)(auVar31._0_4_ < auVar35._0_4_);
                auVar36._4_4_ = -(uint)(auVar31._4_4_ < auVar35._4_4_);
                auVar36._8_4_ = -(uint)(auVar31._8_4_ < auVar35._8_4_);
                auVar36._12_4_ = -(uint)(auVar31._12_4_ < auVar35._12_4_);
                auVar35 = ~auVar36 & auVar30 | auVar38 & auVar36;
                if (SUB164(auVar32 ^ auVar7,4) == -0x80000000 &&
                    SUB164(auVar32 ^ auVar7,0) < -0x7ffffffb) {
                  pTVar16[lVar13 + -1].value = auVar35._0_4_ != 1;
                  pTVar16[lVar13].value = auVar35._4_4_ != 1;
                }
                lVar13 = lVar13 + 2;
                lVar33 = auVar32._8_8_;
                auVar32._0_8_ = auVar32._0_8_ + 2;
                auVar32._8_8_ = lVar33 + 2;
              } while (lVar13 != 6);
              lVar25 = lVar25 + 1;
              pTVar16 = pTVar16 + iVar22;
            } while (lVar25 != 5);
          }
        }
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar4);
    }
  }
  if (0x10 < (int)uVar15) {
    pTVar17 = pTVar9 + uVar18 * 8 + 6;
    uVar20 = 8;
    do {
      vVar21 = ~(byte)uVar20 & true_v;
      pTVar9[uVar20 + uVar18 * 6].value = vVar21;
      uVar20 = uVar20 + 1;
      pTVar17->value = vVar21;
      pTVar17 = pTVar17 + uVar18;
    } while (uVar15 - 8 != uVar20);
  }
  uVar15 = (uint)local_b0;
  local_c0 = version;
  if (7 < uVar15) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Invalid mask pattern");
LAB_0018f675:
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  iVar8 = BitsFromECLevel(ecLevel);
  uVar15 = uVar15 + iVar8 * 8;
  uVar27 = 4;
  do {
    local_128._M_dataplus._M_p._0_1_ = (uVar15 >> (uVar27 & 0x1f) & 1) != 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
               (uchar *)&local_128);
    bVar28 = uVar27 != 0;
    uVar27 = uVar27 - 1;
  } while (bVar28);
  uVar15 = uVar15 * 0x400;
  if (uVar15 != 0) {
    uVar27 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    uVar27 = uVar27 ^ 0x1f;
    do {
      uVar15 = 0x537 << (0x15U - (char)uVar27 & 0x1f) ^ uVar15;
      if (uVar15 == 0) {
        uVar27 = 0;
      }
      else {
        uVar27 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar27 == 0; uVar27 = uVar27 - 1) {
          }
        }
        uVar27 = uVar27 ^ 0x1f;
      }
    } while (0x3ff < uVar15);
  }
  uVar27 = 9;
  do {
    local_128._M_dataplus._M_p._0_1_ = (uVar15 >> (uVar27 & 0x1f) & 1) != 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
               (uchar *)&local_128);
    bVar28 = uVar27 != 0;
    uVar27 = uVar27 - 1;
  } while (bVar28);
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity = 0;
  uVar15 = 0xe;
  do {
    local_128._M_dataplus._M_p._0_1_ = (0x5412U >> (uVar15 & 0x1f) & 1) != 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
               (uchar *)&local_128);
    bVar28 = uVar15 != 0;
    uVar15 = uVar15 - 1;
  } while (bVar28);
  BitArray::bitwiseXOR((BitArray *)&local_e8,(BitArray *)&local_108);
  if ((int)local_e8._M_string_length - (int)local_e8._M_dataplus._M_p != 0xf) {
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              (&local_90,(int)local_e8._M_string_length - (int)local_e8._M_dataplus._M_p);
    std::operator+(&local_128,"Should not happen but we got: ",&local_90);
    std::logic_error::logic_error(plVar11,(string *)&local_128);
    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((pointer)local_108._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_108._M_dataplus._M_p,
                    local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
  }
  uVar15 = (uint)(local_e8._M_string_length - (long)local_e8._M_dataplus._M_p);
  if (0 < (int)uVar15) {
    iVar8 = matrix->_width;
    pTVar9 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = (ulong)(uVar15 & 0x7fffffff);
    iVar34 = (matrix->_height + -0xf) * iVar8;
    iVar22 = iVar8 * 9;
    puVar23 = &DAT_001a3030;
    uVar20 = 0;
    do {
      iVar22 = iVar22 + -1;
      uVar18 = uVar18 - 1;
      if (local_e8._M_string_length - (long)local_e8._M_dataplus._M_p <= uVar18) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      iVar12 = iVar34;
      if (7 >= uVar20) {
        iVar12 = iVar22;
      }
      uVar1 = local_e8._M_dataplus._M_p[uVar18];
      pTVar9[(int)((ulong)*puVar23 >> 0x20) * iVar8 + (int)*puVar23].value = uVar1 != '\0';
      pTVar9[(long)iVar12 + (ulong)(7 < uVar20) * 8].value = uVar1 != '\0';
      uVar20 = uVar20 + 1;
      iVar34 = iVar34 + iVar8;
      puVar23 = puVar23 + 1;
    } while (uVar18 != 0);
  }
  if ((pointer)local_e8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_e8._M_dataplus._M_p,
                    local_e8.field_2._M_allocated_capacity - (long)local_e8._M_dataplus._M_p);
  }
  uVar15 = version->_versionNumber;
  if (6 < (int)uVar15) {
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    uVar27 = 5;
    do {
      local_128._M_dataplus._M_p._0_1_ = (uVar15 >> (uVar27 & 0x1f) & 1) != 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
                 (uchar *)&local_128);
      bVar28 = uVar27 != 0;
      uVar27 = uVar27 - 1;
    } while (bVar28);
    uVar15 = version->_versionNumber << 0xc;
    if (uVar15 != 0) {
      uVar27 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = uVar27 ^ 0x1f;
      do {
        uVar15 = 0x1f25 << (0x13U - (char)uVar27 & 0x1f) ^ uVar15;
        if (uVar15 == 0) {
          uVar27 = 0;
        }
        else {
          uVar27 = 0x1f;
          if (uVar15 != 0) {
            for (; uVar15 >> uVar27 == 0; uVar27 = uVar27 - 1) {
            }
          }
          uVar27 = uVar27 ^ 0x1f;
        }
      } while (0xfff < uVar15);
    }
    uVar27 = 0xb;
    do {
      local_128._M_dataplus._M_p._0_1_ = (uVar15 >> (uVar27 & 0x1f) & 1) != 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,
                 (uchar *)&local_128);
      bVar28 = uVar27 != 0;
      uVar27 = uVar27 - 1;
    } while (bVar28);
    if ((int)(local_108._M_string_length - (long)local_108._M_dataplus._M_p) != 0x12) {
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string
                (&local_90,(int)local_108._M_string_length - (int)local_108._M_dataplus._M_p);
      std::operator+(&local_128,"Should not happen but we got: ",&local_90);
      std::logic_error::logic_error(plVar11,(string *)&local_128);
      __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    iVar8 = 0;
    uVar18 = 0x11;
    do {
      iVar22 = matrix->_width;
      iVar34 = matrix->_height;
      pTVar9 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar12 = (iVar34 + -0xb) * iVar22 + iVar8;
      lVar25 = 0;
      uVar20 = (long)(int)uVar18;
      do {
        if (local_108._M_string_length - (long)local_108._M_dataplus._M_p <= uVar20) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        uVar18 = uVar20 - 1;
        uVar1 = local_108._M_dataplus._M_p[uVar20];
        pTVar9[iVar12].value = uVar1 != '\0';
        pTVar9[iVar22 * iVar8 + iVar34 + -0xb + (int)lVar25].value = uVar1 != '\0';
        lVar25 = lVar25 + 1;
        iVar12 = iVar12 + iVar22;
        uVar20 = uVar18;
      } while (lVar25 != 3);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 6);
    if ((pointer)local_108._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
  }
  local_a0 = (long)matrix->_width;
  iVar8 = 0;
  if (1 < local_a0) {
    iVar22 = matrix->_height;
    local_98 = (long)iVar22;
    uVar15 = matrix->_width - 1;
    uVar27 = iVar22 - 1;
    local_70 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl
               .super__Vector_impl_data._M_start;
    iVar8 = 0;
    local_130 = -1;
    do {
      uVar18 = (ulong)uVar27;
      uVar2 = uVar15;
      if (uVar15 == 6) {
        uVar2 = 5;
      }
      uVar20 = (ulong)uVar2;
      if ((int)uVar27 < iVar22 && -1 < (int)uVar27) {
        local_58 = (long)local_130;
        pTVar9 = local_70 + local_a0 * uVar18;
        local_60 = local_a0 * local_58;
        iVar12 = uVar2 * uVar27;
        local_a4 = uVar2 * local_130;
        iVar34 = -uVar27;
        do {
          puVar5 = (local_b8->_bits).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar14 = (long)(local_b8->_bits).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar5;
          iVar39 = (int)uVar18;
          local_c0 = (Version *)(CONCAT44(local_c0._4_4_,(int)(uVar18 >> 1)) & 0xffffffff7fffffff);
          lVar25 = (long)(int)uVar2;
          iVar37 = iVar12;
          do {
            local_68 = uVar20;
            if (pTVar9[lVar25].value != empty_v) goto LAB_0018f5a9;
            if (iVar8 < (int)uVar14) {
              if (uVar14 <= (ulong)(long)iVar8) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              bVar28 = puVar5[iVar8] != '\0';
            }
            else {
              bVar28 = false;
            }
            iVar24 = (int)lVar25;
            bVar29 = (uVar18 & 1) == 0;
            switch((int)local_b0) {
            case 0:
              uVar15 = iVar39 + iVar24;
              goto LAB_0018f59c;
            case 1:
              break;
            case 2:
              goto LAB_0018f4ee;
            case 3:
              iVar24 = iVar39 + iVar24;
LAB_0018f4ee:
              bVar29 = iVar24 * -0x55555555 + 0x2aaaaaaaU < 0x55555555;
              break;
            case 4:
              uVar15 = iVar24 / 3 + (int)local_c0;
              goto LAB_0018f59c;
            case 5:
              uVar15 = iVar37 * -0x55555555 + 0x2aaaaaaa;
              bVar29 = (uVar15 >> 1 | (uint)((uVar15 & 1) != 0) << 0x1f) < 0x2aaaaaab;
              break;
            case 6:
              bVar29 = iVar37 % 6 < 3;
              break;
            case 7:
              uVar15 = iVar37 % 3 + iVar39 + iVar24;
LAB_0018f59c:
              bVar29 = (uVar15 & 1) == 0;
              break;
            case -1:
              goto switchD_0018f4ca_caseD_ffffffff;
            default:
              piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar10,"QRCode maskIndex out of range");
              goto LAB_0018f675;
            }
            bVar28 = (bool)(bVar28 ^ bVar29);
switchD_0018f4ca_caseD_ffffffff:
            iVar8 = iVar8 + 1;
            pTVar9[lVar25].value = bVar28;
LAB_0018f5a9:
            iVar37 = iVar37 + iVar34;
            bVar28 = (int)uVar2 <= lVar25;
            lVar25 = lVar25 + -1;
          } while (bVar28);
          uVar18 = uVar18 + local_58;
          if ((long)uVar18 < 0) break;
          pTVar9 = pTVar9 + local_60;
          iVar12 = iVar12 + local_a4;
          iVar34 = iVar34 - local_130;
        } while ((long)uVar18 < local_98);
      }
      uVar27 = (int)uVar18 - local_130;
      local_130 = -local_130;
      uVar15 = uVar2 - 2;
    } while (2 < (int)uVar2);
  }
  if (iVar8 < *(int *)&(local_b8->_bits).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(local_b8->_bits).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_e8,iVar8);
    std::operator+(&local_108,"Not all bits consumed: ",&local_e8);
    std::operator+(&local_90,&local_108,'/');
    std::__cxx11::to_string
              (&local_50,
               *(int *)&(local_b8->_bits).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&(local_b8->_bits).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    std::operator+(&local_128,&local_90,&local_50);
    std::invalid_argument::invalid_argument(piVar10,(string *)&local_128);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void BuildMatrix(const BitArray& dataBits, ErrorCorrectionLevel ecLevel, const Version& version, int maskPattern, TritMatrix& matrix)
{
	matrix.clear();
	// Let's get started with embedding big squares at corners.
	EmbedPositionDetectionPatternsAndSeparators(matrix);
	// Then, embed the dark dot at the left bottom corner.
	EmbedDarkDotAtLeftBottomCorner(matrix);
	// Position adjustment patterns appear if version >= 2.
	EmbedPositionAdjustmentPatterns(version, matrix);
	// Timing patterns should be embedded after position adj. patterns.
	EmbedTimingPatterns(matrix);
	// Type information appear with any version.
	EmbedTypeInfo(ecLevel, maskPattern, matrix);
	// Version info appear if version >= 7.
	EmbedVersionInfo(version, matrix);
	// Data should be embedded at end.
	EmbedDataBits(dataBits, maskPattern, matrix);
}